

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8AnyPolicyTest14Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section8AnyPolicyTest14Subpart2
          (Section8AnyPolicyTest14Subpart2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8AnyPolicyTest14Subpart2) {
  const char* const certs[] = {"TrustAnchorRootCertificate", "anyPolicyCACert",
                               "AnyPolicyTest14EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "anyPolicyCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.14";
  info.should_validate = false;
  info.SetInitialPolicySet("NIST-test-policy-2");
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}